

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable ARKodeSPRKTable_Load(ARKODE_SPRKMethodID id)

{
  undefined4 in_EDI;
  ARKodeSPRKTable local_8;
  
  switch(in_EDI) {
  case 0:
    local_8 = arkodeSymplecticEuler();
    break;
  case 1:
    local_8 = arkodeSymplecticLeapfrog2();
    break;
  case 2:
    local_8 = arkodeSymplecticPseudoLeapfrog2();
    break;
  case 3:
    local_8 = arkodeSymplecticRuth3();
    break;
  case 4:
    local_8 = arkodeSymplecticMcLachlan2();
    break;
  case 5:
    local_8 = arkodeSymplecticMcLachlan3();
    break;
  case 6:
    local_8 = arkodeSymplecticCandyRozmus4();
    break;
  case 7:
    local_8 = arkodeSymplecticMcLachlan4();
    break;
  case 8:
    local_8 = arkodeSymplecticMcLachlan5();
    break;
  case 9:
    local_8 = arkodeSymplecticYoshida6();
    break;
  case 10:
    local_8 = arkodeSymplecticSuzukiUmeno816();
    break;
  case 0xb:
    local_8 = arkodeSymplecticSofroniou10();
    break;
  default:
    local_8 = (ARKodeSPRKTable)0x0;
  }
  return local_8;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_Load(ARKODE_SPRKMethodID id)
{
  switch (id)
  {
  case ARKODE_SPRK_EULER_1_1: return arkodeSymplecticEuler();
  case ARKODE_SPRK_LEAPFROG_2_2: return arkodeSymplecticLeapfrog2();
  case ARKODE_SPRK_PSEUDO_LEAPFROG_2_2:
    return arkodeSymplecticPseudoLeapfrog2();
  case ARKODE_SPRK_RUTH_3_3: return arkodeSymplecticRuth3();
  case ARKODE_SPRK_MCLACHLAN_2_2: return arkodeSymplecticMcLachlan2();
  case ARKODE_SPRK_MCLACHLAN_3_3: return arkodeSymplecticMcLachlan3();
  case ARKODE_SPRK_MCLACHLAN_4_4: return arkodeSymplecticMcLachlan4();
  case ARKODE_SPRK_CANDY_ROZMUS_4_4: return arkodeSymplecticCandyRozmus4();
  case ARKODE_SPRK_MCLACHLAN_5_6: return arkodeSymplecticMcLachlan5();
  case ARKODE_SPRK_YOSHIDA_6_8: return arkodeSymplecticYoshida6();
  case ARKODE_SPRK_SUZUKI_UMENO_8_16: return arkodeSymplecticSuzukiUmeno816();
  case ARKODE_SPRK_SOFRONIOU_10_36: return arkodeSymplecticSofroniou10();
  default: return NULL;
  }
}